

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty.c
# Opt level: O3

int main(void)

{
  int iVar1;
  time_t tVar2;
  GLFWwindow *handle;
  float fVar3;
  float fVar4;
  int result;
  int height;
  thrd_t thread;
  GLsizei local_48;
  float local_44;
  float local_40;
  GLsizei local_3c;
  thrd_t local_38;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    handle = glfwCreateWindow(0x280,0x1e0,"Empty Event Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      gladLoadGL(glfwGetProcAddress);
      glfwSetKeyCallback(handle,key_callback);
      iVar1 = thrd_create(&local_38,thread_main,(void *)0x0);
      if (iVar1 == 1) {
        if (running != 0) {
          do {
            iVar1 = rand();
            fVar4 = (float)iVar1 * 4.656613e-10;
            iVar1 = rand();
            fVar3 = (float)iVar1 * 4.656613e-10;
            iVar1 = rand();
            local_40 = (float)iVar1 * 4.656613e-10;
            local_44 = SQRT(local_40 * local_40 + fVar4 * fVar4 + fVar3 * fVar3);
            glfwGetFramebufferSize(handle,&local_48,&local_3c);
            (*glad_glViewport)(0,0,local_48,local_3c);
            (*glad_glClearColor)(fVar4 / local_44,fVar3 / local_44,local_40 / local_44,1.0);
            (*glad_glClear)(0x4000);
            glfwSwapBuffers(handle);
            glfwWaitEvents();
            iVar1 = glfwWindowShouldClose(handle);
            if (iVar1 != 0) {
              running = 0;
            }
          } while (running != 0);
        }
        glfwHideWindow(handle);
        thrd_join(local_38,&local_48);
        glfwDestroyWindow(handle);
        glfwTerminate();
        exit(0);
      }
      fwrite("Failed to create secondary thread\n",0x22,1,_stderr);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int result;
    thrd_t thread;
    GLFWwindow* window;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    window = glfwCreateWindow(640, 480, "Empty Event Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    glfwSetKeyCallback(window, key_callback);

    if (thrd_create(&thread, thread_main, NULL) != thrd_success)
    {
        fprintf(stderr, "Failed to create secondary thread\n");

        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    while (running)
    {
        int width, height;
        float r = nrand(), g = nrand(), b = nrand();
        float l = (float) sqrt(r * r + g * g + b * b);

        glfwGetFramebufferSize(window, &width, &height);

        glViewport(0, 0, width, height);
        glClearColor(r / l, g / l, b / l, 1.f);
        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(window);

        glfwWaitEvents();

        if (glfwWindowShouldClose(window))
            running = GLFW_FALSE;
    }

    glfwHideWindow(window);
    thrd_join(thread, &result);
    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}